

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int ffi_callback_set(lua_State *L,GCfunc *fn)

{
  byte bVar1;
  GCtab *t;
  int iVar2;
  uint uVar3;
  uint uVar4;
  GCcdata *pGVar5;
  TValue *pTVar6;
  ulong uVar7;
  long lVar8;
  GCobj *o;
  long *plVar9;
  
  pGVar5 = ffi_checkcdata(L,(uint32_t)fn);
  plVar9 = (long *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  plVar9[2] = (long)L;
  lVar8 = (ulong)pGVar5->ctypeid * 0x10;
  if (((((*(uint *)(*plVar9 + lVar8) & 0xf0000000) == 0x20000000) &&
       (*(int *)(*plVar9 + lVar8 + 4) == 8)) && ((ulong)((long)pGVar5[1] - plVar9[0x17]) < 0x1000))
     && (((iVar2 = (int)((long)pGVar5[1] - plVar9[0x17]), uVar3 = iVar2 - 8,
          uVar3 = (uVar3 / 0x8c) * 0x20 + (int)((ulong)uVar3 % 0x8c >> 2),
          (uVar3 >> 5) * 0xc + uVar3 * 4 + 8 == iVar2 && (uVar3 < *(uint *)(plVar9 + 0x19))) &&
         (uVar7 = (ulong)uVar3, *(short *)(plVar9[0x18] + uVar7 * 2) != 0)))) {
    t = (GCtab *)plVar9[5];
    if (uVar3 < t->asize) {
      pTVar6 = (TValue *)((ulong)(t->array).ptr32 + uVar7 * 8);
    }
    else {
      pTVar6 = lj_tab_setinth(L,t,uVar3);
    }
    if (fn == (GCfunc *)0x0) {
      (pTVar6->field_2).it = 0xffffffff;
      *(undefined2 *)(plVar9[0x18] + uVar7 * 2) = 0;
      uVar4 = *(uint *)((long)plVar9 + 0xcc);
      if (uVar3 < *(uint *)((long)plVar9 + 0xcc)) {
        uVar4 = uVar3;
      }
      *(uint *)((long)plVar9 + 0xcc) = uVar4;
    }
    else {
      (pTVar6->u32).lo = (uint32_t)fn;
      (pTVar6->field_2).it = 0xfffffff7;
      bVar1 = t->marked;
      uVar4 = (uint)CONCAT71((int7)((ulong)pTVar6 >> 8),bVar1);
      if ((bVar1 & 4) != 0) {
        uVar7 = (ulong)(L->glref).ptr32;
        t->marked = bVar1 & 0xfb;
        uVar4 = *(uint *)(uVar7 + 0x3c);
        (t->gclist).gcptr32 = uVar4;
        *(int *)(uVar7 + 0x3c) = (int)t;
      }
    }
    return uVar4;
  }
  lj_err_caller(L,LJ_ERR_FFI_BADCBACK);
}

Assistant:

static int ffi_callback_set(lua_State *L, GCfunc *fn)
{
  GCcdata *cd = ffi_checkcdata(L, 1);
  CTState *cts = ctype_cts(L);
  CType *ct = ctype_raw(cts, cd->ctypeid);
  if (ctype_isptr(ct->info) && (LJ_32 || ct->size == 8)) {
    MSize slot = lj_ccallback_ptr2slot(cts, *(void **)cdataptr(cd));
    if (slot < cts->cb.sizeid && cts->cb.cbid[slot] != 0) {
      GCtab *t = cts->miscmap;
      TValue *tv = lj_tab_setint(L, t, (int32_t)slot);
      if (fn) {
	setfuncV(L, tv, fn);
	lj_gc_anybarriert(L, t);
      } else {
	setnilV(tv);
	cts->cb.cbid[slot] = 0;
	cts->cb.topid = slot < cts->cb.topid ? slot : cts->cb.topid;
      }
      return 0;
    }
  }
  lj_err_caller(L, LJ_ERR_FFI_BADCBACK);
  return 0;
}